

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool common_download_file_multiple
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *urls,string *bearer_token)

{
  bool bVar1;
  const_iterator __fn;
  const_iterator __args;
  iterator this;
  string *in_RSI;
  undefined8 in_RDI;
  future<bool> *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *__range1_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> futures_download;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *in_stack_ffffffffffffff50;
  future<bool> *in_stack_ffffffffffffff70;
  string local_80 [48];
  reference local_50;
  bool local_1;
  
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)0x1a5c14);
  __fn = std::
         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  __args = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&stack0xffffffffffffffc0);
    std::__cxx11::string::string(local_80,in_RSI);
    std::
    async<common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)::__0,std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              ((launch)((ulong)in_RDI >> 0x20),(type *)__fn._M_current,__args._M_current);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::push_back
              (in_stack_ffffffffffffff50,
               (value_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::future<bool>::~future((future<bool> *)0x1a5cbc);
    common_download_file_multiple(std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>const&,std::__cxx11::string_const&)
    ::$_0::~__0((type *)0x1a5cc6);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  this = std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::begin
                   ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::end
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar1) {
      local_1 = true;
LAB_001a5db8:
      std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
                ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)this._M_current);
      return local_1;
    }
    in_stack_ffffffffffffff50 =
         (vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
         __gnu_cxx::
         __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
         ::operator*((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                      *)&stack0xffffffffffffff60);
    bVar1 = std::future<bool>::get(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff48 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff48);
    if (!bVar1) {
      local_1 = false;
      goto LAB_001a5db8;
    }
    __gnu_cxx::
    __normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
    ::operator++((__normal_iterator<std::future<bool>_*,_std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>_>
                  *)&stack0xffffffffffffff60);
  } while( true );
}

Assistant:

static bool common_download_file_multiple(const std::vector<std::pair<std::string, std::string>> & urls, const std::string & bearer_token) {
    // Prepare download in parallel
    std::vector<std::future<bool>> futures_download;
    for (auto const & item : urls) {
        futures_download.push_back(std::async(std::launch::async, [bearer_token](const std::pair<std::string, std::string> & it) -> bool {
            return common_download_file_single(it.first, it.second, bearer_token);
        }, item));
    }

    // Wait for all downloads to complete
    for (auto & f : futures_download) {
        if (!f.get()) {
            return false;
        }
    }

    return true;
}